

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcDec.c
# Opt level: O3

void Bdc_SuppMinimize(Bdc_Man_t *p,Bdc_Isf_t *pIsf)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int iVar;
  timespec ts;
  timespec local_30;
  
  if (p->pPars->fVerbose == 0) {
    lVar2 = 0;
  }
  else {
    iVar1 = clock_gettime(3,&local_30);
    if (iVar1 < 0) {
      lVar2 = 1;
    }
    else {
      lVar2 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_30.tv_nsec),8);
      lVar2 = ((lVar2 >> 7) - (lVar2 >> 0x3f)) + local_30.tv_sec * -1000000;
    }
  }
  pIsf->uSupp = 0;
  iVar1 = p->nVars;
  if (0 < iVar1) {
    iVar = 0;
    do {
      iVar1 = Kit_TruthVarInSupport(pIsf->puOn,iVar1,iVar);
      if (iVar1 == 0) {
        iVar1 = Kit_TruthVarInSupport(pIsf->puOff,p->nVars,iVar);
        if (iVar1 != 0) goto LAB_005cb21c;
      }
      else {
LAB_005cb21c:
        iVar1 = Kit_TruthVarIsVacuous(pIsf->puOn,pIsf->puOff,p->nVars,iVar);
        if (iVar1 == 0) {
          pIsf->uSupp = pIsf->uSupp | 1 << ((byte)iVar & 0x1f);
        }
        else {
          Kit_TruthExist(pIsf->puOn,p->nVars,iVar);
          Kit_TruthExist(pIsf->puOff,p->nVars,iVar);
        }
      }
      iVar = iVar + 1;
      iVar1 = p->nVars;
    } while (iVar < iVar1);
  }
  if (p->pPars->fVerbose != 0) {
    iVar1 = clock_gettime(3,&local_30);
    if (iVar1 < 0) {
      lVar3 = -1;
    }
    else {
      lVar3 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
    }
    p->timeSupps = p->timeSupps + lVar3 + lVar2;
  }
  return;
}

Assistant:

void Bdc_SuppMinimize( Bdc_Man_t * p, Bdc_Isf_t * pIsf )
{
    int v;
    abctime clk = 0; // Suppress "might be used uninitialized"
    if ( p->pPars->fVerbose )
        clk = Abc_Clock();
    // go through the support variables
    pIsf->uSupp = 0;
    for ( v = 0; v < p->nVars; v++ )
    {
        if ( !Kit_TruthVarInSupport( pIsf->puOn, p->nVars, v ) && 
             !Kit_TruthVarInSupport( pIsf->puOff, p->nVars, v ) )
              continue;
        if ( Kit_TruthVarIsVacuous( pIsf->puOn, pIsf->puOff, p->nVars, v ) )
        {
            Kit_TruthExist( pIsf->puOn, p->nVars, v );
            Kit_TruthExist( pIsf->puOff, p->nVars, v );
            continue;
        }
        pIsf->uSupp |= (1 << v);
    }
    if ( p->pPars->fVerbose )
        p->timeSupps += Abc_Clock() - clk;
}